

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O3

void __thiscall MetaSim::Simulation::initSingleRun(Simulation *this)

{
  (this->globTime).v = 0;
  Entity::callNewRun();
  BaseStat::newRun();
  return;
}

Assistant:

void Simulation::initSingleRun()
    {
        globTime = 0;

        // Run Initialization:
        // Before each run, call the newRun() of every entity
        // and setup statistics
        Entity::callNewRun();

        BaseStat::newRun();
    }